

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader_impl.hpp
# Opt level: O0

A * __thiscall hiberlite::BeanLoader::loadBean<A>(BeanLoader *this,bean_key *key)

{
  A *obj;
  bean_key local_38;
  A *local_20;
  A *bean;
  bean_key *key_local;
  BeanLoader *this_local;
  
  bean = (A *)key;
  key_local = (bean_key *)this;
  construct<hiberlite::BeanLoader,A>(this,&local_20,0);
  obj = local_20;
  bean_key::bean_key(&local_38,key);
  AVisitor<hiberlite::LoadBean>::startWalk<A>
            (&this->super_AVisitor<hiberlite::LoadBean>,obj,&local_38);
  bean_key::~bean_key(&local_38);
  return local_20;
}

Assistant:

C* BeanLoader::loadBean(bean_key key)
{
	C* bean;
	construct(*this, &bean, static_cast<unsigned int>(0));
	startWalk(*bean, key);
	return bean;
}